

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_test.c
# Opt level: O0

void test_ipc_ping_pong_many(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  bool bVar4;
  undefined4 uVar5;
  nng_err result__10;
  nng_err result__9;
  int rv__1;
  size_t sz__1;
  char buf__1 [64];
  nng_err result__8;
  int rv_;
  size_t sz_;
  char buf_ [64];
  int local_38;
  nng_err result__7;
  int i;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  char *addr;
  nng_socket s1;
  nng_socket s0;
  
  nuts_scratch_addr("ipc",0x40,test_ipc_ping_pong_many::nuts_addr_);
  nVar1 = nng_pair1_open((nng_socket *)((long)&addr + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0xb5,"%s: expected success, got %s (%d)","nng_pair1_open(&(s0))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_pair1_open((nng_socket *)&addr);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0xb6,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(addr._4_4_,"recv-timeout",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0xb7,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(addr._4_4_,"send-timeout",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0xb8,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s0, NNG_OPT_SENDTIMEO, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(addr._0_4_,"recv-timeout",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0xb9,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_socket_set_ms(addr._0_4_,"send-timeout",100);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0xba,"%s: expected success, got %s (%d)",
                         "nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nuts_marry_ex(addr._4_4_,addr._0_4_,test_ipc_ping_pong_many::nuts_addr_,(nng_pipe *)0x0,
                        (nng_pipe *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                         ,0xbc,"%s: expected success, got %s (%d)",
                         "nuts_marry_ex(s0, s1, addr, ((void*)0), ((void*)0))",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  local_38 = 0;
  while( true ) {
    if (99 < local_38) {
      nVar1 = nng_socket_close(addr._4_4_);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                             ,0xc4,"%s: expected success, got %s (%d)","nng_socket_close(s0)",pcVar3
                             ,nVar1);
      if (iVar2 == 0) {
        acutest_abort_();
      }
      nVar1 = nng_socket_close(addr._0_4_);
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                             ,0xc5,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar3
                             ,nVar1);
      if (iVar2 == 0) {
        acutest_abort_();
      }
      return;
    }
    nVar1 = nng_send(addr._4_4_,"ping",5,0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                           ,0xbf,"%s: expected success, got %s (%d)",
                           "nng_send(s0, \"ping\", strlen(\"ping\") + 1, 0)",pcVar3,nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
    _result__8 = 0x40;
    num = nng_recv(addr._0_4_,&sz_,(size_t *)&result__8,0);
    buf__1._60_4_ = num;
    pcVar3 = nng_strerror(num);
    acutest_check_((uint)(num == NNG_OK),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                   ,0xc0,"nng_recv (%d %s)",(ulong)num,pcVar3,nVar1);
    acutest_check_((uint)(_result__8 == 5),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                   ,0xc0,"length %d want %d",_result__8 & 0xffffffff,5);
    buf_[0x37] = '\0';
    iVar2 = strcmp("ping",(char *)&sz_);
    acutest_check_((uint)(iVar2 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                   ,0xc0,"%s == %s","ping",&sz_);
    buf__1._56_4_ = nng_send(addr._0_4_,"pong",5,0);
    bVar4 = buf__1._56_4_ == NNG_OK;
    pcVar3 = nng_strerror(buf__1._56_4_);
    uVar5 = buf__1._56_4_;
    iVar2 = acutest_check_((uint)bVar4,
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                           ,0xc1,"%s: expected success, got %s (%d)",
                           "nng_send(s1, \"pong\", strlen(\"pong\") + 1, 0)",pcVar3,buf__1._56_4_);
    if (iVar2 == 0) break;
    _result__9 = 0x40;
    nVar1 = nng_recv(addr._4_4_,&sz__1,(size_t *)&result__9,0);
    pcVar3 = nng_strerror(nVar1);
    acutest_check_((uint)(nVar1 == NNG_OK),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                   ,0xc2,"nng_recv (%d %s)",(ulong)nVar1,pcVar3,uVar5);
    acutest_check_((uint)(_result__9 == 5),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                   ,0xc2,"length %d want %d",_result__9 & 0xffffffff,5);
    buf__1[0x37] = '\0';
    iVar2 = strcmp("pong",(char *)&sz__1);
    acutest_check_((uint)(iVar2 == 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/ipc/ipc_test.c"
                   ,0xc2,"%s == %s","pong",&sz__1);
    local_38 = local_38 + 1;
  }
  acutest_abort_();
}

Assistant:

void
test_ipc_ping_pong_many(void)
{
	nng_socket s0;
	nng_socket s1;
	char      *addr;

	NUTS_ADDR(addr, "ipc");
	NUTS_OPEN(s0);
	NUTS_OPEN(s1);
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s0, NNG_OPT_SENDTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_RECVTIMEO, 100));
	NUTS_PASS(nng_socket_set_ms(s1, NNG_OPT_SENDTIMEO, 100));

	NUTS_MARRY_EX(s0, s1, addr, NULL, NULL);

	for (int i = 0; i < 100; i++) {
		NUTS_SEND(s0, "ping");
		NUTS_RECV(s1, "ping");
		NUTS_SEND(s1, "pong");
		NUTS_RECV(s0, "pong");
	}
	NUTS_CLOSE(s0);
	NUTS_CLOSE(s1);
}